

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,basic_value<toml::type_config> *v)

{
  undefined1 *in_RSI;
  value_with_format<long,_toml::integer_format_info> *in_RDI;
  preserve_comments *in_stack_ffffffffffffffb8;
  preserve_comments *in_stack_ffffffffffffffc0;
  value_with_format<long,_toml::integer_format_info> *v_00;
  region *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  *(undefined1 *)&in_RDI->value = *in_RSI;
  v_00 = (value_with_format<long,_toml::integer_format_info> *)&in_RDI[1].format;
  toml::detail::region::region
            ((region *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  preserve_comments::preserve_comments(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  switch((char)in_RDI->value) {
  case '\x01':
    assigner<toml::detail::value_with_format<bool,toml::boolean_format_info>,toml::detail::value_with_format<bool,toml::boolean_format_info>const&>
              ((value_with_format<bool,_toml::boolean_format_info> *)&in_RDI->format,
               (value_with_format<bool,_toml::boolean_format_info> *)(in_RSI + 8));
    break;
  case '\x02':
    assigner<toml::detail::value_with_format<long,toml::integer_format_info>,toml::detail::value_with_format<long,toml::integer_format_info>const&>
              (in_RDI,v_00);
    break;
  case '\x03':
    assigner<toml::detail::value_with_format<double,toml::floating_format_info>,toml::detail::value_with_format<double,toml::floating_format_info>const&>
              ((value_with_format<double,_toml::floating_format_info> *)in_RDI,
               (value_with_format<double,_toml::floating_format_info> *)v_00);
    break;
  case '\x04':
    assigner<toml::detail::value_with_format<std::__cxx11::string,toml::string_format_info>,toml::detail::value_with_format<std::__cxx11::string,toml::string_format_info>const&>
              ((value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                *)in_RDI,
               (value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                *)v_00);
    break;
  case '\x05':
    assigner<toml::detail::value_with_format<toml::offset_datetime,toml::offset_datetime_format_info>,toml::detail::value_with_format<toml::offset_datetime,toml::offset_datetime_format_info>const&>
              ((value_with_format<toml::offset_datetime,_toml::offset_datetime_format_info> *)
               &in_RDI->format,
               (value_with_format<toml::offset_datetime,_toml::offset_datetime_format_info> *)
               (in_RSI + 8));
    break;
  case '\x06':
    assigner<toml::detail::value_with_format<toml::local_datetime,toml::local_datetime_format_info>,toml::detail::value_with_format<toml::local_datetime,toml::local_datetime_format_info>const&>
              ((value_with_format<toml::local_datetime,_toml::local_datetime_format_info> *)
               &in_RDI->format,
               (value_with_format<toml::local_datetime,_toml::local_datetime_format_info> *)
               (in_RSI + 8));
    break;
  case '\a':
    assigner<toml::detail::value_with_format<toml::local_date,toml::local_date_format_info>,toml::detail::value_with_format<toml::local_date,toml::local_date_format_info>const&>
              ((value_with_format<toml::local_date,_toml::local_date_format_info> *)&in_RDI->format,
               (value_with_format<toml::local_date,_toml::local_date_format_info> *)(in_RSI + 8));
    break;
  case '\b':
    assigner<toml::detail::value_with_format<toml::local_time,toml::local_time_format_info>,toml::detail::value_with_format<toml::local_time,toml::local_time_format_info>const&>
              ((value_with_format<toml::local_time,_toml::local_time_format_info> *)&in_RDI->format,
               (value_with_format<toml::local_time,_toml::local_time_format_info> *)(in_RSI + 8));
    break;
  case '\t':
    assigner<toml::detail::value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>>,toml::array_format_info>,toml::detail::value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>>,toml::array_format_info>const&>
              ((value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                *)in_RDI,
               (value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                *)v_00);
    break;
  case '\n':
    assigner<toml::detail::value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::type_config>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>>>,toml::table_format_info>,toml::detail::value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::type_config>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>>>,toml::table_format_info>const&>
              ((value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                *)in_RDI,
               (value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                *)v_00);
    break;
  default:
    assigner<char,char>((char *)&in_RDI->format,&stack0xffffffffffffffe3);
  }
  return;
}

Assistant:

basic_value(const basic_value& v)
        : type_(v.type_), region_(v.region_), comments_(v.comments_)
    {
        switch(this->type_)
        {
            case value_t::boolean        : assigner(boolean_        , v.boolean_        ); break;
            case value_t::integer        : assigner(integer_        , v.integer_        ); break;
            case value_t::floating       : assigner(floating_       , v.floating_       ); break;
            case value_t::string         : assigner(string_         , v.string_         ); break;
            case value_t::offset_datetime: assigner(offset_datetime_, v.offset_datetime_); break;
            case value_t::local_datetime : assigner(local_datetime_ , v.local_datetime_ ); break;
            case value_t::local_date     : assigner(local_date_     , v.local_date_     ); break;
            case value_t::local_time     : assigner(local_time_     , v.local_time_     ); break;
            case value_t::array          : assigner(array_          , v.array_          ); break;
            case value_t::table          : assigner(table_          , v.table_          ); break;
            default                      : assigner(empty_          , '\0'              ); break;
        }
    }